

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O2

int __thiscall
supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>::remove
          (KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long> *this,
          char *__filename)

{
  NotImplementedException *this_00;
  allocator<char> local_39;
  string local_38 [32];
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Remove for abstract KeyValueStorage",&local_39);
  supermap::NotImplementedException::NotImplementedException(this_00,local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

virtual void remove(const Key &) {
        throw NotImplementedException("Remove for abstract KeyValueStorage");
    }